

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O2

callbacks pstore::exchange::import_ns::callbacks::make<pstore::exchange::import_ns::root>
                    (not_null<pstore::database_*> db)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  callbacks cVar1;
  shared_ptr<pstore::exchange::import_ns::context> ctxt;
  _Head_base<0UL,_pstore::exchange::import_ns::root_*,_false> local_40;
  _Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false> local_38;
  shared_ptr<pstore::exchange::import_ns::context> local_30;
  element_type *local_20;
  
  std::
  make_shared<pstore::exchange::import_ns::context,pstore::gsl::not_null<pstore::database*>const&>
            ((not_null<pstore::database_*> *)&local_30);
  local_20 = local_30.
             super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  std::make_unique<pstore::exchange::import_ns::root,pstore::exchange::import_ns::context*>
            ((context **)&local_40);
  local_38._M_head_impl = &(local_40._M_head_impl)->super_rule;
  local_40._M_head_impl = (root *)0x0;
  callbacks((callbacks *)in_RDI,&local_30,
            (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
             *)&local_38);
  if (local_38._M_head_impl != (rule *)0x0) {
    (*((rule *)&(local_38._M_head_impl)->_vptr_rule)->_vptr_rule[1])();
  }
  local_38._M_head_impl = (rule *)0x0;
  std::
  unique_ptr<pstore::exchange::import_ns::root,_std::default_delete<pstore::exchange::import_ns::root>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::root,_std::default_delete<pstore::exchange::import_ns::root>_>
                 *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.
              super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  cVar1.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  cVar1.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (callbacks)
         cVar1.context_.
         super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static callbacks make (gsl::not_null<database *> const db, Args... args) {
                    auto ctxt = std::make_shared<context> (db);
                    return {ctxt, std::make_unique<Rule> (ctxt.get (), args...)};
                }